

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.h
# Opt level: O0

void __thiscall
soplex::SPxBoundFlippingRT<double>::setTolerances
          (SPxBoundFlippingRT<double> *this,shared_ptr<soplex::Tolerances> *tolerances)

{
  SSVectorBase<double> *this_00;
  long in_RDI;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffffa8;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffffb0;
  
  std::shared_ptr<soplex::Tolerances>::operator=
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this_00 = (SSVectorBase<double> *)(in_RDI + 0x80);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)this_00,in_stack_ffffffffffffffa8);
  SSVectorBase<double>::setTolerances(this_00,in_stack_ffffffffffffffa8);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x23727e);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)this_00,in_stack_ffffffffffffffa8);
  SSVectorBase<double>::setTolerances(this_00,in_stack_ffffffffffffffa8);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2372b6);
  return;
}

Assistant:

void setTolerances(std::shared_ptr<Tolerances> tolerances)
   {
      this->_tolerances = tolerances;
      this->updPrimRhs.setTolerances(tolerances);
      this->updPrimVec.setTolerances(tolerances);
   }